

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Gather64(int g_a,void *v,int64_t **subsArray,int64_t n)

{
  Integer nv;
  Integer a;
  int i;
  int64_t idx;
  Integer in_stack_000001d0;
  Integer in_stack_000001d8;
  void *in_stack_000001e0;
  void *in_stack_000001e8;
  Integer in_stack_000001f0;
  
  pnga_gather(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
              in_stack_000001d0);
  return;
}

Assistant:

void NGA_Gather64(int g_a, void *v, int64_t* subsArray[], int64_t n)
{
    int64_t idx;
    int i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
#ifndef USE_GATSCAT_NEW
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx][i] + 1;
    wnga_gather(a, v, _subs_array, 0, nv);
    free(_subs_array);
#else
    wnga_gather(a, v, subsArray, 1, nv);
#endif
}